

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawutil.cpp
# Opt level: O2

void qDrawShadePanel(QPainter *p,int x,int y,int w,int h,QPalette *pal,bool sunken,int lineWidth,
                    QBrush *fill)

{
  undefined8 uVar1;
  undefined8 uVar2;
  bool bVar3;
  char cVar4;
  QBrush *pQVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  long in_FS_OFFSET;
  bool bVar9;
  qreal p1;
  int local_108;
  int iStack_104;
  QArrayDataPointer<QLineF> local_a8;
  QLineF local_88;
  undefined6 local_68;
  undefined2 uStack_62;
  undefined6 uStack_60;
  undefined2 uStack_5a;
  undefined6 local_58;
  undefined2 uStack_52;
  undefined6 uStack_50;
  undefined2 uStack_4a;
  QPainterStateGuard local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (h != 0 && w != 0) {
    if ((h | w | lineWidth) < 0) {
      local_88.pt1.xp._0_4_ = 2;
      local_88.pt2.xp._4_4_ = 0;
      local_88.pt1.xp._4_4_ = 0;
      local_88.pt1.yp._0_4_ = 0;
      local_88.pt1.yp._4_4_ = 0;
      local_88.pt2.xp._0_4_ = 0;
      local_88.pt2.yp = 3.05543930413181e-317;
      QMessageLogger::warning((char *)&local_88,"qDrawShadePanel: Invalid parameters");
    }
    local_48.m_level = 0;
    local_48._12_4_ = 0xaaaaaaaa;
    local_48.m_painter = p;
    QPainterStateGuard::save(&local_48);
    p1 = QStyleHelper::getDpr(p);
    bVar3 = qFuzzyCompare(p1,1.0);
    if (!bVar3) {
      QPainter::scale(1.0 / p1,1.0 / p1);
      x = (int)((double)((ulong)((double)x * p1) & 0x8000000000000000 | 0x3fe0000000000000) +
               (double)x * p1);
      y = (int)((double)((ulong)((double)y * p1) & 0x8000000000000000 | 0x3fe0000000000000) +
               (double)y * p1);
      w = (int)((double)w * p1);
      h = (int)((double)h * p1);
      lineWidth = (int)((double)((ulong)((double)lineWidth * p1) & 0x8000000000000000 |
                                0x3fe0000000000000) + (double)lineWidth * p1);
      QPainter::translate(p,0.5,0.5);
    }
    pQVar5 = QPalette::dark(pal);
    uVar1 = *(undefined8 *)(*(long *)pQVar5 + 8);
    uVar2 = *(undefined8 *)(*(long *)pQVar5 + 0x10);
    local_58 = (undefined6)uVar1;
    uStack_52 = (undefined2)((ulong)uVar1 >> 0x30);
    uStack_50 = (undefined6)uVar2;
    uStack_4a = (undefined2)((ulong)uVar2 >> 0x30);
    pQVar5 = QPalette::light(pal);
    uVar1 = *(undefined8 *)(*(long *)pQVar5 + 8);
    uVar2 = *(undefined8 *)(*(long *)pQVar5 + 0x10);
    local_68 = (undefined6)uVar1;
    uStack_62 = (undefined2)((ulong)uVar1 >> 0x30);
    uStack_60 = (undefined6)uVar2;
    uStack_5a = (undefined2)((ulong)uVar2 >> 0x30);
    if (fill != (QBrush *)0x0) {
      cVar4 = QColor::operator==((QColor *)(*(long *)fill + 8),(QColor *)&local_58);
      if (cVar4 != '\0') {
        pQVar5 = QPalette::shadow(pal);
        uVar1 = *(undefined8 *)(*(long *)pQVar5 + 0xe);
        local_58 = (undefined6)*(undefined8 *)(*(long *)pQVar5 + 8);
        uStack_52 = (undefined2)uVar1;
        uStack_50 = (undefined6)((ulong)uVar1 >> 0x10);
      }
      cVar4 = QColor::operator==((QColor *)(*(long *)fill + 8),(QColor *)&local_68);
      if (cVar4 != '\0') {
        pQVar5 = QPalette::midlight(pal);
        uVar1 = *(undefined8 *)(*(long *)pQVar5 + 0xe);
        local_68 = (undefined6)*(undefined8 *)(*(long *)pQVar5 + 8);
        uStack_62 = (undefined2)uVar1;
        uStack_60 = (undefined6)((ulong)uVar1 >> 0x10);
      }
    }
    local_a8.size = 0;
    local_a8.d = (Data *)0x0;
    local_a8.ptr = (QLineF *)0x0;
    QList<QLineF>::reserve((QList<QLineF> *)&local_a8,(long)(lineWidth * 2));
    QPainter::setPen((QColor *)p);
    uVar7 = 0;
    if (0 < lineWidth) {
      uVar7 = lineWidth;
    }
    iStack_104 = x + w + -2;
    local_108 = y;
    uVar6 = uVar7;
    while (bVar9 = uVar6 != 0, uVar6 = uVar6 - 1, bVar9) {
      local_88.pt2.yp = (qreal)local_108;
      local_88.pt2.xp = (qreal)iStack_104;
      local_108 = local_108 + 1;
      iStack_104 = iStack_104 + -1;
      local_88.pt1.yp = local_88.pt2.yp;
      local_88.pt1.xp = (double)x;
      QList<QLineF>::emplaceBack<QLineF>((QList<QLineF> *)&local_a8,&local_88);
    }
    iStack_104 = local_108;
    local_108 = x;
    uVar6 = uVar7;
    while (bVar9 = uVar6 != 0, uVar6 = uVar6 - 1, bVar9) {
      local_88.pt1.xp = (qreal)local_108;
      local_88.pt2.yp = (qreal)iStack_104;
      local_108 = local_108 + 1;
      iStack_104 = iStack_104 + -1;
      local_88.pt2.xp = local_88.pt1.xp;
      local_88.pt1.yp = (qreal)(double)(y + h + -2);
      QList<QLineF>::emplaceBack<QLineF>((QList<QLineF> *)&local_a8,&local_88);
    }
    QPainter::drawLines(p,(QList<QLineF> *)&local_a8);
    QList<QLineF>::clear((QList<QLineF> *)&local_a8);
    QPainter::setPen((QColor *)p);
    local_108 = x + w + -1;
    iVar8 = h + -1 + y;
    uVar6 = uVar7;
    while (bVar9 = uVar6 != 0, uVar6 = uVar6 - 1, bVar9) {
      local_88.pt1.xp = (qreal)x;
      x = x + 1;
      local_88.pt2.yp = (qreal)iVar8;
      local_88.pt1.yp = local_88.pt2.yp;
      local_88.pt2.xp = (double)local_108;
      QList<QLineF>::emplaceBack<QLineF>((QList<QLineF> *)&local_a8,&local_88);
      iVar8 = iVar8 + -1;
    }
    iStack_104 = y;
    while (bVar9 = uVar7 != 0, uVar7 = uVar7 - 1, bVar9) {
      local_88.pt1.xp = (qreal)local_108;
      local_88.pt1.yp = (qreal)iStack_104;
      local_108 = local_108 + -1;
      iStack_104 = iStack_104 + 1;
      local_88.pt2.yp = (qreal)(double)(y + h + ~lineWidth);
      local_88.pt2.xp = local_88.pt1.xp;
      QList<QLineF>::emplaceBack<QLineF>((QList<QLineF> *)&local_a8,&local_88);
    }
    QPainter::drawLines(p,(QList<QLineF> *)&local_a8);
    if (fill != (QBrush *)0x0) {
      if (!bVar3) {
        QPainter::translate(p,-0.5,-0.5);
      }
      QPainter::fillRect(p,lineWidth,y + lineWidth,w + lineWidth * -2,h + lineWidth * -2,fill);
    }
    QArrayDataPointer<QLineF>::~QArrayDataPointer(&local_a8);
    QPainterStateGuard::~QPainterStateGuard(&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void qDrawShadePanel(QPainter *p, int x, int y, int w, int h,
                      const QPalette &pal, bool sunken,
                      int lineWidth, const QBrush *fill)
{
    if (w == 0 || h == 0)
        return;
    if (Q_UNLIKELY(w < 0 || h < 0 || lineWidth < 0)) {
        qWarning("qDrawShadePanel: Invalid parameters");
    }

    QPainterStateGuard painterGuard(p);
    const qreal devicePixelRatio = QStyleHelper::getDpr(p);
    bool isTranslated = false;
    if (!qFuzzyCompare(devicePixelRatio, qreal(1))) {
        const qreal inverseScale = qreal(1) / devicePixelRatio;
        p->scale(inverseScale, inverseScale);
        x = qRound(devicePixelRatio * x);
        y = qRound(devicePixelRatio * y);
        w = devicePixelRatio * w;
        h = devicePixelRatio * h;
        lineWidth = qRound(devicePixelRatio * lineWidth);
        p->translate(0.5, 0.5);
        isTranslated = true;
    }

    QColor shade = pal.dark().color();
    QColor light = pal.light().color();
    if (fill) {
        if (fill->color() == shade)
            shade = pal.shadow().color();
        if (fill->color() == light)
            light = pal.midlight().color();
    }
    QList<QLineF> lines;
    lines.reserve(2*lineWidth);

    if (sunken)
        p->setPen(shade);
    else
        p->setPen(light);
    int x1, y1, x2, y2;
    int i;
    x1 = x;
    y1 = y2 = y;
    x2 = x+w-2;
    for (i=0; i<lineWidth; i++) {                // top shadow
        lines << QLineF(x1, y1++, x2--, y2++);
    }
    x2 = x1;
    y1 = y+h-2;
    for (i=0; i<lineWidth; i++) {                // left shado
        lines << QLineF(x1++, y1, x2++, y2--);
    }
    p->drawLines(lines);
    lines.clear();
    if (sunken)
        p->setPen(light);
    else
        p->setPen(shade);
    x1 = x;
    y1 = y2 = y+h-1;
    x2 = x+w-1;
    for (i=0; i<lineWidth; i++) {                // bottom shadow
        lines << QLineF(x1++, y1--, x2, y2--);
    }
    x1 = x2;
    y1 = y;
    y2 = y+h-lineWidth-1;
    for (i=0; i<lineWidth; i++) {                // right shadow
        lines << QLineF(x1--, y1++, x2--, y2);
    }
    p->drawLines(lines);
    if (fill) {                                // fill with fill color
        if (isTranslated)
            p->translate(-0.5, -0.5);
        p->fillRect(x+lineWidth, y+lineWidth, w-lineWidth*2, h-lineWidth*2, *fill);
    }
}